

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O0

void __thiscall deqp::gls::LifetimeTests::details::LifeTest::testBind(LifeTest *this)

{
  Type *pTVar1;
  GLuint GVar2;
  GLenum err;
  int iVar3;
  TestContext *testCtx;
  Binder *pBVar4;
  Functions *pFVar5;
  undefined1 local_40 [8];
  Name name;
  ResultCollector errors;
  LifeTest *this_local;
  
  testCtx = tcu::TestNode::getTestContext((TestNode *)this);
  ResultCollector::ResultCollector((ResultCollector *)&name.m_name,testCtx);
  Name::Name((Name *)local_40,this->m_type);
  pBVar4 = binder(this);
  GVar2 = Name::operator*((Name *)local_40);
  (*pBVar4->_vptr_Binder[2])(pBVar4,(ulong)GVar2);
  pFVar5 = TestBase::gl(&this->super_TestBase);
  err = (*pFVar5->getError)();
  glu::checkError(err,"Bind failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                  ,0x30a);
  pTVar1 = this->m_type;
  GVar2 = Name::operator*((Name *)local_40);
  iVar3 = (*pTVar1->_vptr_Type[4])(pTVar1,(ulong)GVar2);
  ResultCollector::check
            ((ResultCollector *)&name.m_name,(bool)((byte)iVar3 & 1),
             "Object does not exist after binding");
  pBVar4 = binder(this);
  (*pBVar4->_vptr_Binder[2])(pBVar4,0);
  Name::~Name((Name *)local_40);
  ResultCollector::~ResultCollector((ResultCollector *)&name.m_name);
  return;
}

Assistant:

void LifeTest::testBind (void)
{
	ResultCollector	errors	(getTestContext());
	Name			name	(m_type);

	binder().bind(*name);
	GLU_EXPECT_NO_ERROR(gl().getError(), "Bind failed");
	errors.check(m_type.exists(*name), "Object does not exist after binding");
	binder().bind(0);
}